

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

Pass * wasm::createInlineMainPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  InlineMainPass::InlineMainPass((InlineMainPass *)this);
  return this;
}

Assistant:

Pass* createInlineMainPass() { return new InlineMainPass(); }